

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LICMPass::HoistInstruction(LICMPass *this,Loop *loop,Instruction *inst)

{
  Op OVar1;
  Instruction *this_00;
  IRContext *this_01;
  Instruction *previous_node;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_38;
  Instruction *insertion_point;
  BasicBlock *pre_header_bb;
  Instruction *inst_local;
  Loop *loop_local;
  LICMPass *this_local;
  
  pre_header_bb = (BasicBlock *)inst;
  inst_local = (Instruction *)loop;
  loop_local = (Loop *)this;
  insertion_point = (Instruction *)Loop::GetOrCreatePreHeaderBlock(loop);
  if ((BasicBlock *)insertion_point != (BasicBlock *)0x0) {
    BasicBlock::tail((BasicBlock *)&previous_node);
    local_38._M_head_impl =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*
                   ((iterator_template<spvtools::opt::Instruction> *)&previous_node);
    this_00 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::PreviousNode
                        (&(local_38._M_head_impl)->
                          super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    if ((this_00 != (Instruction *)0x0) &&
       ((OVar1 = Instruction::opcode(this_00), OVar1 == OpLoopMerge ||
        (OVar1 = Instruction::opcode(this_00), OVar1 == OpSelectionMerge)))) {
      local_38._M_head_impl = this_00;
    }
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              ((IntrusiveNodeBase<spvtools::opt::Instruction> *)pre_header_bb,local_38._M_head_impl)
    ;
    this_01 = Pass::context(&this->super_Pass);
    IRContext::set_instr_block(this_01,(Instruction *)pre_header_bb,(BasicBlock *)insertion_point);
    return true;
  }
  return false;
}

Assistant:

bool LICMPass::HoistInstruction(Loop* loop, Instruction* inst) {
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* pre_header_bb = loop->GetOrCreatePreHeaderBlock();
  if (!pre_header_bb) {
    return false;
  }
  Instruction* insertion_point = &*pre_header_bb->tail();
  Instruction* previous_node = insertion_point->PreviousNode();
  if (previous_node && (previous_node->opcode() == spv::Op::OpLoopMerge ||
                        previous_node->opcode() == spv::Op::OpSelectionMerge)) {
    insertion_point = previous_node;
  }

  inst->InsertBefore(insertion_point);
  context()->set_instr_block(inst, pre_header_bb);
  return true;
}